

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# as-02-unwrap.cpp
# Opt level: O2

CommandOptions * read_JP2K_file(CommandOptions *Options,IFileReaderFactory *fileReaderFactory)

{
  MDD_t MVar1;
  uint uVar2;
  long *plVar3;
  undefined8 uVar4;
  AESDecContext *this;
  IFileReaderFactory *in_RDX;
  uint uVar5;
  allocator<char> local_659;
  HMACContext *local_658;
  AESDecContext *local_650;
  MXFReader Reader;
  ui32_t write_count;
  Result_t result;
  FrameBuffer FrameBuffer;
  RGBAEssenceDescriptor *rgba_descriptor;
  string local_530 [32];
  FileWriter OutFile;
  char name_format [64];
  WriterInfo Info;
  
  AS_02::JP2K::MXFReader::MXFReader(&Reader,in_RDX);
  ASDCP::JP2K::FrameBuffer::FrameBuffer
            (&FrameBuffer,*(ui32_t *)((long)&fileReaderFactory[4]._vptr_IFileReaderFactory + 4));
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&Info,(char *)fileReaderFactory[0xb]._vptr_IFileReaderFactory,
             (allocator<char> *)&rgba_descriptor);
  AS_02::JP2K::MXFReader::OpenRead((string *)&result);
  std::__cxx11::string::~string((string *)&Info);
  if (_result < 0) {
    uVar2 = 0;
LAB_00108087:
    local_650 = (AESDecContext *)0x0;
LAB_00108090:
    local_658 = (HMACContext *)0x0;
  }
  else {
    if (*(char *)((long)&fileReaderFactory->_vptr_IFileReaderFactory + 5) == '\x01') {
      fprintf(_stderr,"Frame Buffer size: %u\n",
              (ulong)*(uint *)((long)&fileReaderFactory[4]._vptr_IFileReaderFactory + 4));
    }
    rgba_descriptor = (RGBAEssenceDescriptor *)0x0;
    name_format[0] = '\0';
    name_format[1] = '\0';
    name_format[2] = '\0';
    name_format[3] = '\0';
    name_format[4] = '\0';
    name_format[5] = '\0';
    name_format[6] = '\0';
    name_format[7] = '\0';
    plVar3 = (long *)AS_02::JP2K::MXFReader::OP1aHeader();
    MVar1 = ASDCP::DefaultCompositeDict();
    uVar4 = ASDCP::Dictionary::Type(MVar1);
    (**(code **)(*plVar3 + 0xa8))(&Info,plVar3,uVar4,&rgba_descriptor);
    Kumu::Result_t::operator=(&result,(Result_t *)&Info);
    Kumu::Result_t::~Result_t((Result_t *)&Info);
    if (_result < 0) {
      plVar3 = (long *)AS_02::JP2K::MXFReader::OP1aHeader();
      MVar1 = ASDCP::DefaultCompositeDict();
      uVar4 = ASDCP::Dictionary::Type(MVar1);
      (**(code **)(*plVar3 + 0xa8))(&Info,plVar3,uVar4,name_format);
      Kumu::Result_t::operator=(&result,(Result_t *)&Info);
      Kumu::Result_t::~Result_t((Result_t *)&Info);
      if (_result < 0) {
        fwrite("File does not contain an essence descriptor.\n",0x2d,1,_stderr);
        AS_02::JP2K::MXFReader::AS02IndexReader();
        uVar2 = AS_02::MXF::AS02IndexReader::GetDuration();
      }
      else {
        if (name_format._0_8_ == 0) {
          __assert_fail("cdci_descriptor",
                        "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/as-02-unwrap.cpp"
                        ,0x14f,
                        "Result_t read_JP2K_file(CommandOptions &, const Kumu::IFileReaderFactory &)"
                       );
        }
        uVar2 = 0;
        if (*(char *)(name_format._0_8_ + 0x100) == '\x01') {
          uVar2 = *(uint *)(name_format._0_8_ + 0xf8);
        }
        if (*(char *)((long)&fileReaderFactory->_vptr_IFileReaderFactory + 5) == '\x01') {
          (**(code **)(*(long *)name_format._0_8_ + 0x88))(name_format._0_8_,0);
        }
      }
    }
    else {
      if (rgba_descriptor == (RGBAEssenceDescriptor *)0x0) {
        __assert_fail("rgba_descriptor",
                      "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/as-02-unwrap.cpp"
                      ,0x13e,
                      "Result_t read_JP2K_file(CommandOptions &, const Kumu::IFileReaderFactory &)")
        ;
      }
      uVar2 = 0;
      if (rgba_descriptor[0x100] == (RGBAEssenceDescriptor)0x1) {
        uVar2 = *(uint *)(rgba_descriptor + 0xf8);
      }
      if (*(char *)((long)&fileReaderFactory->_vptr_IFileReaderFactory + 5) == '\x01') {
        (**(code **)(*(long *)rgba_descriptor + 0x88))(rgba_descriptor,0);
      }
    }
    if (uVar2 == 0) {
      AS_02::JP2K::MXFReader::AS02IndexReader();
      uVar2 = AS_02::MXF::AS02IndexReader::GetDuration();
      if (uVar2 == 0) {
        fwrite("Unable to determine file duration.\n",0x23,1,_stderr);
        Kumu::Result_t::Result_t((Result_t *)Options,(Result_t *)&Kumu::RESULT_FAIL);
        goto LAB_00108295;
      }
    }
    if ((_result < 0) ||
       (*(char *)((long)&fileReaderFactory->_vptr_IFileReaderFactory + 1) != '\x01'))
    goto LAB_00108087;
    this = (AESDecContext *)operator_new(8);
    ASDCP::AESDecContext::AESDecContext(this);
    ASDCP::AESDecContext::InitKey(Info.ProductUUID);
    Kumu::Result_t::operator=(&result,(Result_t *)&Info);
    Kumu::Result_t::~Result_t((Result_t *)&Info);
    local_650 = this;
    if ((_result < 0) ||
       (*(char *)((long)&fileReaderFactory->_vptr_IFileReaderFactory + 2) != '\x01'))
    goto LAB_00108090;
    ASDCP::WriterInfo::WriterInfo(&Info);
    AS_02::JP2K::MXFReader::FillWriterInfo((WriterInfo *)&stack0xffffffffffffff68);
    Kumu::Result_t::~Result_t((Result_t *)&stack0xffffffffffffff68);
    if (Info.UsesHMAC == true) {
      local_658 = (HMACContext *)operator_new(8);
      ASDCP::HMACContext::HMACContext(local_658);
      ASDCP::HMACContext::InitKey((uchar *)&rgba_descriptor,(LabelSet_t)local_658);
      Kumu::Result_t::operator=(&result,(Result_t *)&rgba_descriptor);
      Kumu::Result_t::~Result_t((Result_t *)&rgba_descriptor);
    }
    else {
      fputs("File does not contain HMAC values, ignoring -m option.\n",_stderr);
      local_658 = (HMACContext *)0x0;
    }
    ASDCP::WriterInfo::~WriterInfo(&Info);
  }
  uVar5 = *(uint *)&fileReaderFactory[3]._vptr_IFileReaderFactory;
  if (*(uint *)&fileReaderFactory[3]._vptr_IFileReaderFactory == 0) {
    uVar5 = uVar2;
  }
  uVar5 = uVar5 + *(int *)((long)&fileReaderFactory[2]._vptr_IFileReaderFactory + 4);
  if (uVar2 <= uVar5) {
    uVar5 = uVar2;
  }
  snprintf(name_format,0x40,"%%s%%0%du.j2c",
           (ulong)*(uint *)&fileReaderFactory[2]._vptr_IFileReaderFactory);
  for (uVar2 = *(uint *)((long)&fileReaderFactory[2]._vptr_IFileReaderFactory + 4);
      (-1 < _result && (uVar2 < uVar5)); uVar2 = uVar2 + 1) {
    AS_02::JP2K::MXFReader::ReadFrame
              ((uint)&Info,(FrameBuffer *)&Reader,(AESDecContext *)(ulong)uVar2,
               (HMACContext *)&FrameBuffer);
    Kumu::Result_t::operator=(&result,(Result_t *)&Info);
    Kumu::Result_t::~Result_t((Result_t *)&Info);
    snprintf((char *)&Info,0x400,name_format,fileReaderFactory[6]._vptr_IFileReaderFactory,
             (ulong)uVar2);
    if (-1 < _result) {
      if (*(char *)((long)&fileReaderFactory->_vptr_IFileReaderFactory + 5) == '\x01') {
        printf("Frame %d, %d bytes",(ulong)uVar2,(ulong)(uint)FrameBuffer._24_4_);
        if (*(char *)((long)&fileReaderFactory[1]._vptr_IFileReaderFactory + 4) == '\0') {
          printf(" -> %s",&Info);
        }
        putchar(10);
        if (_result < 0) goto LAB_0010827f;
      }
      if (*(char *)((long)&fileReaderFactory[1]._vptr_IFileReaderFactory + 4) == '\0') {
        Kumu::FileWriter::FileWriter(&OutFile);
        std::__cxx11::string::string<std::allocator<char>>(local_530,(char *)&Info,&local_659);
        Kumu::FileWriter::OpenWrite((string *)&rgba_descriptor);
        Kumu::Result_t::operator=(&result,(Result_t *)&rgba_descriptor);
        Kumu::Result_t::~Result_t((Result_t *)&rgba_descriptor);
        std::__cxx11::string::~string(local_530);
        if (-1 < _result) {
          Kumu::FileWriter::Write
                    ((uchar *)&rgba_descriptor,(uint)&OutFile,(uint *)FrameBuffer._8_8_);
          Kumu::Result_t::operator=(&result,(Result_t *)&rgba_descriptor);
          Kumu::Result_t::~Result_t((Result_t *)&rgba_descriptor);
          if ((-1 < _result) &&
             (*(char *)((long)&fileReaderFactory->_vptr_IFileReaderFactory + 5) == '\x01')) {
            ASDCP::JP2K::FrameBuffer::Dump((_IO_FILE *)&FrameBuffer,(uint)_stderr);
          }
        }
        Kumu::FileWriter::~FileWriter(&OutFile);
      }
    }
LAB_0010827f:
  }
  Kumu::Result_t::Result_t((Result_t *)Options,&result);
LAB_00108295:
  Kumu::Result_t::~Result_t(&result);
  ASDCP::FrameBuffer::~FrameBuffer(&FrameBuffer.super_FrameBuffer);
  AS_02::JP2K::MXFReader::~MXFReader(&Reader);
  return Options;
}

Assistant:

Result_t
read_JP2K_file(CommandOptions& Options, const Kumu::IFileReaderFactory& fileReaderFactory)
{
  AESDecContext*         Context = 0;
  HMACContext*           HMAC = 0;
  AS_02::JP2K::MXFReader Reader(fileReaderFactory);
  JP2K::FrameBuffer      FrameBuffer(Options.fb_size);
  ui32_t                 frame_count = 0;

  Result_t result = Reader.OpenRead(Options.input_filename);

  if ( ASDCP_SUCCESS(result) )
    {
      if ( Options.verbose_flag )
	{
	  fprintf(stderr, "Frame Buffer size: %u\n", Options.fb_size);
	}

      ASDCP::MXF::RGBAEssenceDescriptor *rgba_descriptor = 0;
      ASDCP::MXF::CDCIEssenceDescriptor *cdci_descriptor = 0;

      result = Reader.OP1aHeader().GetMDObjectByType(DefaultCompositeDict().ul(MDD_RGBAEssenceDescriptor),
						     reinterpret_cast<MXF::InterchangeObject**>(&rgba_descriptor));

      if ( KM_SUCCESS(result) )
	{
	  assert(rgba_descriptor);
          if ( ! rgba_descriptor->ContainerDuration.empty() )
            {
	      frame_count = (ui32_t)rgba_descriptor->ContainerDuration;
            }
	  if ( Options.verbose_flag )
	    {
	      rgba_descriptor->Dump();
	    }
	}
      else
	{
	  result = Reader.OP1aHeader().GetMDObjectByType(DefaultCompositeDict().ul(MDD_CDCIEssenceDescriptor),
							 reinterpret_cast<MXF::InterchangeObject**>(&cdci_descriptor));

	  if ( KM_SUCCESS(result) )
	    {
	      assert(cdci_descriptor);
              if ( ! cdci_descriptor->ContainerDuration.empty() )
                {
	          frame_count = (ui32_t)cdci_descriptor->ContainerDuration;
                }
	      if ( Options.verbose_flag )
		{
		  cdci_descriptor->Dump();
		}
	    }
	  else
	    {
	      fprintf(stderr, "File does not contain an essence descriptor.\n");
	      frame_count = Reader.AS02IndexReader().GetDuration();
	    }
	}

      if ( frame_count == 0 )
	{
	  frame_count = Reader.AS02IndexReader().GetDuration();
	}

      if ( frame_count == 0 )
	{
	  fprintf(stderr, "Unable to determine file duration.\n");
	  return RESULT_FAIL;
	}
    }

#ifdef HAVE_OPENSSL
  if ( ASDCP_SUCCESS(result) && Options.key_flag )
    {
      Context = new AESDecContext;
      result = Context->InitKey(Options.key_value);

      if ( ASDCP_SUCCESS(result) && Options.read_hmac )
	{
	  WriterInfo Info;
	  Reader.FillWriterInfo(Info);

	  if ( Info.UsesHMAC )
	    {
	      HMAC = new HMACContext;
	      result = HMAC->InitKey(Options.key_value, Info.LabelSetType);
	    }
	  else
	    {
	      fputs("File does not contain HMAC values, ignoring -m option.\n", stderr);
	    }
	}
    }
#endif // HAVE_OPENSSL

  ui32_t last_frame = Options.start_frame + ( Options.duration ? Options.duration : frame_count);
  if ( last_frame > frame_count )
    last_frame = frame_count;

  char name_format[64];
  snprintf(name_format,  64, "%%s%%0%du.j2c", Options.number_width);

  for ( ui32_t i = Options.start_frame; ASDCP_SUCCESS(result) && i < last_frame; i++ )
    {
      result = Reader.ReadFrame(i, FrameBuffer, Context, HMAC);

      char filename[1024];
      snprintf(filename, 1024, name_format, Options.file_prefix, i);

      if ( ASDCP_SUCCESS(result) && Options.verbose_flag )
	{
	  printf("Frame %d, %d bytes", i, FrameBuffer.Size());

	  if ( ! Options.no_write_flag )
	    {
	      printf(" -> %s", filename);
	    }

	  printf("\n");
	}

      if ( ASDCP_SUCCESS(result)  && ( ! Options.no_write_flag ) )
	{
	  Kumu::FileWriter OutFile;
	  ui32_t write_count;
	  result = OutFile.OpenWrite(filename);

	  if ( ASDCP_SUCCESS(result) )
	    result = OutFile.Write(FrameBuffer.Data(), FrameBuffer.Size(), &write_count);

	  if ( ASDCP_SUCCESS(result) && Options.verbose_flag )
	    {
	      FrameBuffer.Dump(stderr, Options.fb_dump_size);
	    }
	}
    }

  return result;
}